

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O2

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::create_page(LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  progress_guarantee i_progress_guarantee_00;
  void *pvVar1;
  undefined8 *puVar2;
  uintptr_t uint_pointer;
  
  if (i_progress_guarantee == LfQueue_Throwing) {
    pvVar1 = basic_default_allocator<65536UL>::allocate_page_zeroed
                       ((basic_default_allocator<65536UL> *)this);
    if (pvVar1 == (void *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  else {
    i_progress_guarantee_00 = i_progress_guarantee == LfQueue_LockFree ^ progress_wait_free;
    if (i_progress_guarantee == LfQueue_Blocking) {
      i_progress_guarantee_00 = progress_blocking;
    }
    pvVar1 = basic_default_allocator<65536UL>::try_allocate_page_zeroed
                       ((basic_default_allocator<65536UL> *)this,i_progress_guarantee_00);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
  }
  raw_atomic_store((uintptr_t *)((ulong)pvVar1 & 0xffffffffffff0000 | 0xffc0),8,memory_order_seq_cst
                  );
  return (uintptr_t)pvVar1;
}

Assistant:

uintptr_t create_page(LfQueue_ProgressGuarantee const i_progress_guarantee)
            {
                auto const new_page = static_cast<ControlBlock *>(
                  i_progress_guarantee == LfQueue_Throwing
                    ? ALLOCATOR_TYPE::allocate_page_zeroed()
                    : ALLOCATOR_TYPE::try_allocate_page_zeroed(
                        ToDenGuarantee(i_progress_guarantee)));
                if (new_page != nullptr)
                {
                    ControlBlock * const new_page_end_block = get_end_control_block(new_page);
                    raw_atomic_store(
                      &new_page_end_block->m_next, uintptr_t(LfQueue_InvalidNextPage));
                }
                else
                {
                    if (i_progress_guarantee == LfQueue_Throwing)
                    {
                        throw std::bad_alloc();
                    }
                }
                return reinterpret_cast<uintptr_t>(new_page);
            }